

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluSupportSize(word *t,int nVars)

{
  int iVar1;
  int iVar;
  int iVar2;
  int iVar3;
  
  iVar = 0;
  iVar2 = 0;
  if (0 < nVars) {
    iVar2 = nVars;
  }
  iVar3 = 0;
  for (; iVar2 != iVar; iVar = iVar + 1) {
    iVar1 = If_CluHasVar(t,nVars,iVar);
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

int If_CluSupportSize( word * t, int nVars )
{
    int v, SuppSize = 0;
    for ( v = 0; v < nVars; v++ )
        if ( If_CluHasVar( t, nVars, v ) )
            SuppSize++;
    return SuppSize;
}